

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Op soul::StructuralParser::getOpForTypeMetaFunctionName(QualifiedIdentifier *qi)

{
  Op OVar1;
  Identifier in_stack_ffffffffffffff88;
  size_t local_70;
  
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&stack0xffffffffffffff88,qi);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&stack0xffffffffffffff88);
  OVar1 = none;
  if (local_70 == 1) {
    AST::QualifiedIdentifier::getPath((IdentifierPath *)&stack0xffffffffffffff88,qi);
    IdentifierPath::getFirstPart((IdentifierPath *)&stack0xffffffffffffff88);
    OVar1 = AST::TypeMetaFunction::getOperationForName(in_stack_ffffffffffffff88);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear
              ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&stack0xffffffffffffff88);
  }
  return OVar1;
}

Assistant:

static AST::TypeMetaFunction::Op getOpForTypeMetaFunctionName (const AST::QualifiedIdentifier& qi)
    {
        if (qi.getPath().isUnqualified())
            return AST::TypeMetaFunction::getOperationForName (qi.getPath().getFirstPart());

        return AST::TypeMetaFunction::Op::none;
    }